

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_manager.cpp
# Opt level: O2

string * __thiscall
duckdb::FormatString_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,MangledEntryName *mangled)

{
  pointer pcVar1;
  size_t i;
  ulong uVar2;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  for (uVar2 = 0; uVar2 < __return_storage_ptr__->_M_string_length; uVar2 = uVar2 + 1) {
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    if (pcVar1[uVar2] == '\0') {
      pcVar1[uVar2] = '_';
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static string FormatString(const MangledEntryName &mangled) {
	auto input = mangled.name;
	for (size_t i = 0; i < input.size(); i++) {
		if (input[i] == '\0') {
			input[i] = '_';
		}
	}
	return input;
}